

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_read_obu_header(AV1Context *ctx,BitReadCtx_t *gb,AV1RawOBUHeader *current)

{
  RK_S32 RVar1;
  undefined8 in_RAX;
  RK_U32 value;
  RK_U8 local_24 [4];
  
  local_24[0] = (RK_U8)((ulong)in_RAX >> 0x20);
  RVar1 = mpp_av1_read_unsigned(gb,1,"obu_forbidden_bit",(RK_U32 *)local_24,0,0);
  if (-1 < RVar1) {
    current->obu_forbidden_bit = local_24[0];
    RVar1 = mpp_av1_read_unsigned(gb,4,"obu_type",(RK_U32 *)local_24,0,0xf);
    if (RVar1 < 0) {
      RVar1 = -1;
    }
    else {
      current->obu_type = local_24[0];
      RVar1 = mpp_av1_read_unsigned(gb,1,"obu_extension_flag",(RK_U32 *)local_24,0,1);
      if (RVar1 < 0) {
        RVar1 = -1;
      }
      else {
        current->obu_extension_flag = local_24[0];
        RVar1 = mpp_av1_read_unsigned(gb,1,"obu_has_size_field",(RK_U32 *)local_24,0,1);
        if (RVar1 < 0) {
          RVar1 = -1;
        }
        else {
          current->obu_has_size_field = local_24[0];
          RVar1 = mpp_av1_read_unsigned(gb,1,"obu_reserved_1bit",(RK_U32 *)local_24,0,0);
          if (RVar1 < 0) {
            RVar1 = -1;
          }
          else {
            current->obu_reserved_1bit = local_24[0];
            if (current->obu_extension_flag == '\0') {
              current->temporal_id = '\0';
              current->spatial_id = '\0';
            }
            else {
              RVar1 = mpp_av1_read_unsigned(gb,3,"temporal_id",(RK_U32 *)local_24,0,7);
              if (RVar1 < 0) {
                return -1;
              }
              current->temporal_id = local_24[0];
              RVar1 = mpp_av1_read_unsigned(gb,2,"spatial_id",(RK_U32 *)local_24,0,3);
              if (RVar1 < 0) {
                return -1;
              }
              current->spatial_id = local_24[0];
              RVar1 = mpp_av1_read_unsigned
                                (gb,3,"extension_header_reserved_3bits",(RK_U32 *)local_24,0,0);
              if (RVar1 < 0) {
                return -1;
              }
              current->extension_header_reserved_3bits = local_24[0];
            }
            ctx->temporal_id = (uint)current->temporal_id;
            ctx->spatial_id = (uint)current->spatial_id;
            RVar1 = 0;
          }
        }
      }
    }
  }
  return RVar1;
}

Assistant:

static RK_S32 mpp_av1_read_obu_header(AV1Context *ctx, BitReadCtx_t *gb,
                                      AV1RawOBUHeader *current)
{
    RK_S32 err;

    fc(1, obu_forbidden_bit, 0, 0);

    fc(4, obu_type, 0, AV1_OBU_PADDING);
    flag(obu_extension_flag);
    flag(obu_has_size_field);

    fc(1, obu_reserved_1bit, 0, 0);

    if (current->obu_extension_flag) {
        fb(3, temporal_id);
        fb(2, spatial_id);
        fc(3, extension_header_reserved_3bits, 0, 0);
    } else {
        infer(temporal_id, 0);
        infer(spatial_id, 0);
    }

    ctx->temporal_id = current->temporal_id;
    ctx->spatial_id  = current->spatial_id;

    return 0;
}